

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  uchar ret;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  uchar local_22;
  byte local_21;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  long local_18;
  
  local_20.m_int = 0;
  local_22 = lhs;
  bVar1 = DivisionCornerCaseHelper<long,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1(lhs,rhs,&local_20);
  if (!bVar1) {
    local_21 = 0;
    local_18 = rhs.m_int;
    DivisionHelper<unsigned_char,_long,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_22,&local_18,&local_21)
    ;
    local_20.m_int = (long)local_21;
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_20.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}